

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

TSNode * ts_node__child(TSNode *__return_storage_ptr__,TSNode self,uint32_t child_index,
                       _Bool include_anonymous)

{
  uint32_t uVar1;
  SubtreeHeapData *pSVar2;
  TSTree *_self;
  _Bool _Var3;
  uint uVar4;
  Subtree tree;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  NodeChildIterator iterator;
  uint32_t local_88;
  uint32_t local_84;
  Subtree *local_78;
  TSTree *local_70;
  Subtree local_60;
  TSTree *local_58;
  uint32_t local_50;
  uint32_t uStack_4c;
  uint32_t uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  TSSymbol *local_38;
  
  _self = self.tree;
  local_84 = self.context[0];
  local_88 = self.context[1];
  local_78 = (Subtree *)self.id;
  bVar8 = true;
  local_70 = self.tree;
  uVar1 = self.context[2];
  do {
    if (!bVar8) {
      __return_storage_ptr__->id = (void *)0x0;
      __return_storage_ptr__->tree = (TSTree *)0x0;
      __return_storage_ptr__->context[0] = 0;
      __return_storage_ptr__->context[1] = 0;
      __return_storage_ptr__->context[2] = 0;
      __return_storage_ptr__->context[3] = 0;
      return __return_storage_ptr__;
    }
    local_60 = (Subtree)local_78->ptr;
    if ((((ulong)local_60.ptr & 1) == 0) && ((local_60.ptr)->child_count != 0)) {
      uVar6 = (ulong)((local_60.ptr)->field_17).field_0.alias_sequence_id;
      if (uVar6 == 0) {
        local_38 = (TSSymbol *)0x0;
      }
      else {
        local_38 = local_70->language->alias_sequences +
                   local_70->language->max_alias_sequence_length * uVar6;
      }
      local_50 = local_84;
      uStack_4c = local_88;
      uStack_48 = uVar1;
    }
    else {
      local_60.ptr = (SubtreeHeapData *)0x0;
      local_38 = (TSSymbol *)0x0;
      local_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
    }
    uStack_40 = 0;
    uStack_44 = 0;
    local_58 = local_70;
    _Var3 = ts_node_child_iterator_next((NodeChildIterator *)&local_60.data,__return_storage_ptr__);
    bVar9 = true;
    uVar7 = 0;
    bVar8 = false;
    if (_Var3) {
      do {
        pSVar2 = ((Subtree *)__return_storage_ptr__->id)->ptr;
        if (include_anonymous) {
          if (((ulong)pSVar2 & 1) == 0) {
            uVar5 = (uint)*(ushort *)&pSVar2->field_0x2c;
          }
          else {
            uVar5 = (uint)((ulong)pSVar2 >> 1) & 0x7fffffff;
          }
          if ((uVar5 & 1) == 0) {
            bVar9 = __return_storage_ptr__->context[3] != 0;
LAB_001295a0:
            if (bVar9 == false) goto LAB_001295ae;
          }
LAB_001295a4:
          if (child_index == uVar7) {
            ts_tree_set_cached_parent(_self,__return_storage_ptr__,&self);
            bVar9 = false;
            goto LAB_00129631;
          }
          uVar7 = uVar7 + 1;
        }
        else {
          if (((ulong)pSVar2 & 1) == 0) {
            uVar5 = (uint)*(ushort *)&pSVar2->field_0x2c;
          }
          else {
            uVar5 = (uint)((ulong)pSVar2 >> 1) & 0x7fffffff;
          }
          if ((uVar5 & 1) != 0) {
            if (((ulong)pSVar2 & 1) == 0) {
              uVar5 = *(uint *)&pSVar2->field_0x2c >> 1;
            }
            else {
              uVar5 = (uint)((ulong)pSVar2 >> 2) & 0x3fffffff;
            }
            if ((uVar5 & 1) != 0) goto LAB_001295a4;
          }
          uVar5 = __return_storage_ptr__->context[3];
          if ((uVar5 != 0) && ((ushort)uVar5 != 0xfffe)) {
            if ((uVar5 & 0xffff) != 0xffff) {
              bVar9 = (bool)(((byte)__return_storage_ptr__->tree->language->symbol_metadata
                                    [(ushort)uVar5] & 2) >> 1);
              goto LAB_001295a0;
            }
            goto LAB_001295a4;
          }
LAB_001295ae:
          uVar5 = 0;
          if ((((ulong)pSVar2 & 1) == 0) && (uVar5 = 0, pSVar2->child_count != 0)) {
            if (include_anonymous) {
              uVar5 = (pSVar2->field_17).field_0.visible_child_count;
            }
            else {
              uVar5 = (pSVar2->field_17).field_0.named_child_count;
            }
          }
          uVar4 = child_index - uVar7;
          if (uVar4 < uVar5) {
            local_84 = __return_storage_ptr__->context[0];
            local_88 = __return_storage_ptr__->context[1];
            uVar1 = __return_storage_ptr__->context[2];
            local_70 = __return_storage_ptr__->tree;
            bVar8 = true;
            local_78 = (Subtree *)__return_storage_ptr__->id;
            break;
          }
          uVar7 = uVar7 + uVar5;
        }
        _Var3 = ts_node_child_iterator_next
                          ((NodeChildIterator *)&local_60.data,__return_storage_ptr__);
        uVar4 = child_index;
      } while (_Var3);
      bVar9 = true;
      child_index = uVar4;
    }
LAB_00129631:
    if (!bVar9) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static inline TSNode ts_node__child(TSNode self, uint32_t child_index, bool include_anonymous) {
  TSNode result = self;
  bool did_descend = true;

  while (did_descend) {
    did_descend = false;

    TSNode child;
    uint32_t index = 0;
    NodeChildIterator iterator = ts_node_iterate_children(&result);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (ts_node__is_relevant(child, include_anonymous)) {
        if (index == child_index) {
          ts_tree_set_cached_parent(self.tree, &child, &self);
          return child;
        }
        index++;
      } else {
        uint32_t grandchild_index = child_index - index;
        uint32_t grandchild_count = ts_node__relevant_child_count(child, include_anonymous);
        if (grandchild_index < grandchild_count) {
          did_descend = true;
          result = child;
          child_index = grandchild_index;
          break;
        }
        index += grandchild_count;
      }
    }
  }

  return ts_node__null();
}